

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Noise.cpp
# Opt level: O0

void setup_lattice(Vector *v,long *ix,long *iy,long *iz,long *jx,long *jy,long *jz,double *sx,
                  double *sy,double *sz,double *tx,double *ty,double *tz)

{
  double dVar1;
  long *jy_local;
  long *jx_local;
  long *iz_local;
  long *iy_local;
  long *ix_local;
  Vector *v_local;
  
  v->x = v->x - -10000.0;
  v->y = v->y - -10000.0;
  v->z = v->z - -10000.0;
  *ix = (long)v->x;
  *iy = (long)v->y;
  *iz = (long)v->z;
  *jx = *ix + 1;
  *jy = *iy + 1;
  *jz = *iz + 1;
  dVar1 = spline(v->x - (double)*ix);
  *sx = dVar1;
  dVar1 = spline(v->y - (double)*iy);
  *sy = dVar1;
  dVar1 = spline(v->z - (double)*iz);
  *sz = dVar1;
  *tx = 1.0 - *sx;
  *ty = 1.0 - *sy;
  *tz = 1.0 - *sz;
  return;
}

Assistant:

void setup_lattice(  Vector&  v,
          long& ix,long&   iy,long& iz,
          long& jx,long&   jy,long& jz,
          double& sx,double&  sy,double& sz,
          double& tx,double&  ty,double& tz )
{
   // ensure values are positive
   v.x   -= MINX;
   v.y   -= MINY;
   v.z   -= MINZ;

   // integer lattice point
   ix = (long)v.x;   iy = (long)v.y;   iz = (long)v.z;
   jx = ix  + 1; jy  = iy + 1; jz = iz +  1;

   sx = spline(v.x   - ix); sy = spline(v.y - iy); sz = spline(v.z - iz);
   // complement values of sx,sy,sz
   tx = 1.0 - sx; ty =  1.0   - sy; tz = 1.0 - sz;
}